

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_cmd_ln.c
# Opt level: O2

int parse_cmd_ln(int argc,char **argv)

{
  cmd_ln_t *pcVar1;
  long lVar2;
  long lVar3;
  char examplestr [207];
  char helpstr [427];
  
  memcpy(helpstr,
         "Description: \n\nIncrease the number of mixture of a continuous HMM.  Notice that option \n-ninc actually means the number of mixture one wants to split from the \n original models. For example, if you have already 8 mixture and you \n want to go to 16, then 8 should be specified.  \n\nUsually, the number of mixture is a power of two.  You are also \nrecommended to split the number of mixture from 1 -> 2 -> 4 -> 8 \n-> and so on. \n"
         ,0x1ab);
  memcpy(examplestr,
         "Example : \n\ninc_comp \n -ninc 16 \n -dcountfn mixture_weights \n -inmixwfn mixture_weights \n -outmixwfn out_mixture_weights \n -inmeanfn means \n -outmeanfn out_means \n -invarfn variance \n -outvarfn out_variance"
         ,0xcf);
  cmd_ln_parse(parse_cmd_ln::defn,argc,argv,1);
  pcVar1 = cmd_ln_get();
  lVar2 = cmd_ln_int_r(pcVar1,"-help");
  pcVar1 = cmd_ln_get();
  lVar3 = cmd_ln_int_r(pcVar1,"-example");
  if ((int)lVar2 != 0) {
    printf("%s\n\n",helpstr);
  }
  if ((int)lVar3 != 0) {
    printf("%s\n\n",examplestr);
  }
  if ((int)lVar3 == 0 && (int)lVar2 == 0) {
    return 0;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/parse_cmd_ln.c"
          ,0xa1,"User asked for help or example.\n");
  exit(0);
}

Assistant:

int
parse_cmd_ln(int argc, char *argv[])
{
  uint32      isHelp;
  uint32      isExample;

  const char helpstr[] = 
"Description: \n\
\n\
Increase the number of mixture of a continuous HMM.  Notice that option \n\
-ninc actually means the number of mixture one wants to split from the \n\
 original models. For example, if you have already 8 mixture and you \n\
 want to go to 16, then 8 should be specified.  \n\
\n\
Usually, the number of mixture is a power of two.  You are also \n\
recommended to split the number of mixture from 1 -> 2 -> 4 -> 8 \n\
-> and so on. \n\
";


  const char examplestr[] = 
"Example : \n\
\n\
inc_comp \n\
 -ninc 16 \n\
 -dcountfn mixture_weights \n\
 -inmixwfn mixture_weights \n\
 -outmixwfn out_mixture_weights \n\
 -inmeanfn means \n\
 -outmeanfn out_means \n\
 -invarfn variance \n\
 -outvarfn out_variance";

    static arg_t defn[] = {
	{ "-help",
	  ARG_BOOLEAN,
	  "no",
	  "Shows the usage of the tool"},

	{ "-example",
	  ARG_BOOLEAN,
	  "no",
	  "Shows example of how to use the tool"},

	{ "-ninc",
	  ARG_INT32,
	  "1",
	  "The # of densities to split"},

	{ "-inmixwfn",
	  ARG_STRING,
	  NULL,
	  "The weight file for all N den/mix"},

	{ "-outmixwfn",
	  ARG_STRING,
	  NULL,
	  "The output mixing weight file name w/ N+NINC density weights/mixture"},

	{ "-inmeanfn",
	  ARG_STRING,
	  NULL,
	  "The source mean file w/ N means"},

	{ "-outmeanfn",
	  ARG_STRING,
	  NULL,
	  "The new mean file w/ N+NINC means"},

	{ "-invarfn",
	  ARG_STRING,
	  NULL,
	  "The source variance file w/ N means"},

	{ "-fullvar",
	  ARG_BOOLEAN,
	  "no",
	  "variances file contains full covariances" },

	{ "-outvarfn",
	  ARG_STRING,
	  NULL,
	  "The new variance file w/ N+NINC means"},

	{ "-dcountfn",
	  ARG_STRING,
	  NULL,
	  "The density counts for the N source den/mix"},

	{NULL, 0, NULL, NULL}
    };

    cmd_ln_parse(defn, argc, argv, 1);

    isHelp    = cmd_ln_int32("-help");
    isExample    = cmd_ln_int32("-example");

    if(isHelp){
      printf("%s\n\n",helpstr);
    }

    if(isExample){
      printf("%s\n\n",examplestr);
    }

    if(isHelp || isExample){
      E_INFO("User asked for help or example.\n");
      exit(0);
    }


    return 0;
}